

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_escape.hpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
nlohmann::json_abi_v3_11_2::detail::escape<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,detail *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s)

{
  detail *pdVar1;
  undefined8 uVar2;
  ulong uVar3;
  long *local_68;
  char *local_60;
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38 [2];
  
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"~","");
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"~0","");
  for (uVar3 = std::__cxx11::string::find((char *)this,(ulong)local_68,0);
      uVar3 != 0xffffffffffffffff;
      uVar3 = std::__cxx11::string::find((char *)this,(ulong)local_68,uVar3 + local_40)) {
    std::__cxx11::string::replace((ulong)this,uVar3,local_60,(ulong)local_48);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"/","");
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"~1","");
  for (uVar3 = std::__cxx11::string::find((char *)this,(ulong)local_68,0);
      uVar3 != 0xffffffffffffffff;
      uVar3 = std::__cxx11::string::find((char *)this,(ulong)local_68,uVar3 + local_40)) {
    std::__cxx11::string::replace((ulong)this,uVar3,local_60,(ulong)local_48);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pdVar1 = this + 0x10;
  if (*(detail **)this == pdVar1) {
    uVar2 = *(undefined8 *)(this + 0x18);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *(size_type *)pdVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*(detail **)this;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *(size_type *)pdVar1;
  }
  __return_storage_ptr__->_M_string_length = *(size_type *)(this + 8);
  *(detail **)this = pdVar1;
  *(undefined8 *)(this + 8) = 0;
  this[0x10] = (detail)0x0;
  return __return_storage_ptr__;
}

Assistant:

inline StringType escape(StringType s)
{
    replace_substring(s, StringType{"~"}, StringType{"~0"});
    replace_substring(s, StringType{"/"}, StringType{"~1"});
    return s;
}